

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyHashForEach(SyHash *pHash,_func_sxi32_SyHashEntry_ptr_void_ptr *xStep,void *pUserData)

{
  sxi32 sVar1;
  uint local_38;
  sxu32 n;
  sxi32 rc;
  SyHashEntry_Pr *pEntry;
  void *pUserData_local;
  _func_sxi32_SyHashEntry_ptr_void_ptr *xStep_local;
  SyHash *pHash_local;
  
  _n = pHash->pList;
  local_38 = 0;
  while( true ) {
    if (pHash->nEntry <= local_38) {
      return 0;
    }
    sVar1 = (*xStep)((SyHashEntry *)_n,pUserData);
    if (sVar1 != 0) break;
    _n = _n->pNext;
    local_38 = local_38 + 1;
  }
  return sVar1;
}

Assistant:

JX9_PRIVATE sxi32 SyHashForEach(SyHash *pHash, sxi32 (*xStep)(SyHashEntry *, void *), void *pUserData)
{
	SyHashEntry_Pr *pEntry;
	sxi32 rc;
	sxu32 n;
#if defined(UNTRUST)
	if( INVALID_HASH(pHash) || xStep == 0){
		return 0;
	}
#endif
	pEntry = pHash->pList;
	for( n = 0 ; n < pHash->nEntry ; n++ ){
		/* Invoke the callback */
		rc = xStep((SyHashEntry *)pEntry, pUserData);
		if( rc != SXRET_OK ){
			return rc;
		}
		/* Point to the next entry */
		pEntry = pEntry->pNext;
	}
	return SXRET_OK;
}